

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void trophy_corpse(CHAR_DATA *ch,CHAR_DATA *victim)

{
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  OBJ_INDEX_DATA *pObjIndex;
  TROPHY_DATA *pTVar6;
  TROPHY_DATA *pTVar7;
  OBJ_AFFECT_DATA oaf;
  OBJ_AFFECT_DATA local_80;
  
  pOVar5 = ch->in_room->contents;
  while( true ) {
    if (pOVar5 == (OBJ_DATA *)0x0) {
      get_eq_char(ch,0xd);
      return;
    }
    bVar2 = str_cmp(pOVar5->owner,victim->true_name);
    if (!bVar2) break;
    pOVar5 = pOVar5->next_content;
  }
  pOVar5 = get_eq_char(ch,0xd);
  if ((pOVar5 != (OBJ_DATA *)0x0) && (pOVar5->pIndexData->vnum == 0x5c5d)) {
    iVar3 = number_percent();
    iVar4 = get_skill(ch,(int)gsn_trophy);
    if (iVar4 + 8 < iVar3) {
      act("You mangle $N\'s scalp beyond repair in your attempt to trophy it, and throw it away in disgust."
          ,ch,(void *)0x0,victim,3);
      act("$n mangles $N\'s scalp beyond repair in $s attempt to trophy it, and throws it away in disgust."
          ,ch,(void *)0x0,victim,1);
      check_improve(ch,(int)gsn_trophy,false,1);
      return;
    }
    iVar3 = 0;
    act("With a smooth stroke, you slice $N\'s scalp cleanly from $S head, attaching it to your belt!"
        ,ch,(void *)0x0,victim,3);
    act("$n smoothly slices $N\'s scalp from $S head and attaches it to $s belt!",ch,(void *)0x0,
        victim,1);
    check_improve(ch,(int)gsn_trophy,true,1);
    if (ch->pcdata->trophy == (TROPHY_DATA *)0x0) {
      pOVar5->value[4] = 0;
    }
    else {
      iVar3 = pOVar5->value[4];
    }
    extract_obj(pOVar5);
    pObjIndex = get_obj_index(0);
    pOVar5 = create_object(pObjIndex,0);
    obj_to_char(pOVar5,ch);
    pOVar5->value[4] = iVar3;
    init_affect_obj(&local_80);
    local_80.where = 1;
    local_80.type = gsn_trophy;
    local_80.aftype = 2;
    local_80.level = ch->level;
    local_80.duration = -1;
    local_80.modifier = (short)((pOVar5->value[4] - (pOVar5->value[4] + 1 >> 0x1f)) + 1U >> 1);
    local_80.location = 0x12;
    affect_to_obj(pOVar5,&local_80);
    local_80.location = 0x13;
    iVar3 = pOVar5->value[4];
    iVar3 = ((iVar3 - (iVar3 >> 0x1f) & 0xfffffffeU) - iVar3) +
            ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    local_80.modifier = (short)iVar3 + 1;
    affect_to_obj(pOVar5,&local_80);
    equip_char(ch,pOVar5,0xd,false);
    iVar3 = pOVar5->value[4];
    if (iVar3 == 0) {
      pTVar7 = new_trophy_data(victim->true_name);
      ch->pcdata->trophy = pTVar7;
    }
    else {
      pPVar1 = ch->pcdata;
      pTVar7 = pPVar1->trophy;
      if (1 < iVar3) {
        iVar3 = iVar3 + -1;
        pTVar6 = pTVar7;
        do {
          if ((pTVar6 == (TROPHY_DATA *)0x0) ||
             (pTVar6 = pTVar6->next, pTVar6 == (TROPHY_DATA *)0x0)) break;
          pPVar1->trophy = pTVar6;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      pTVar6 = new_trophy_data(victim->true_name);
      pPVar1 = ch->pcdata;
      pPVar1->trophy->next = pTVar6;
      pPVar1->trophy = pTVar7;
    }
    pOVar5->value[4] = pOVar5->value[4] + 1;
  }
  return;
}

Assistant:

void trophy_corpse(CHAR_DATA *ch, CHAR_DATA *victim)
{
	OBJ_DATA *corpse, *belt, *newbelt;
	OBJ_AFFECT_DATA oaf;
	TROPHY_DATA *placeholder;
	int i, scalps;

	for (corpse = ch->in_room->contents; corpse; corpse = corpse->next_content)
	{
		if (!str_cmp(corpse->owner, victim->true_name))
			break;
	}

	belt = get_eq_char(ch, WEAR_WAIST);

	if (!corpse || !belt || belt->pIndexData->vnum != OBJ_VNUM_TROPHY_BELT)
		return;

	if (number_percent() > get_skill(ch, gsn_trophy) + 8)
	{
		act("You mangle $N's scalp beyond repair in your attempt to trophy it, and throw it away in disgust.", ch, 0, victim, TO_CHAR);
		act("$n mangles $N's scalp beyond repair in $s attempt to trophy it, and throws it away in disgust.", ch, 0, victim, TO_NOTVICT);
		check_improve(ch, gsn_trophy, false, 1);
		return;
	}

	act("With a smooth stroke, you slice $N's scalp cleanly from $S head, attaching it to your belt!", ch, 0, victim, TO_CHAR);
	act("$n smoothly slices $N's scalp from $S head and attaches it to $s belt!", ch, 0, victim, TO_NOTVICT);
	check_improve(ch, gsn_trophy, true, 1);

	if (!ch->pcdata->trophy)
		belt->value[4] = 0;

	/* Update the hit/dam mods on the belt. */

	scalps = belt->value[4];

	extract_obj(belt);

	newbelt = create_object(get_obj_index(23645), 0);
	obj_to_char(newbelt, ch);

	newbelt->value[4] = scalps;

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_APPLY;
	oaf.type = gsn_trophy;
	oaf.aftype = AFT_POWER;
	oaf.level = ch->level;
	oaf.duration = -1;
	oaf.modifier = (newbelt->value[4] + 1) / 2;
	oaf.location = APPLY_HITROLL;
	affect_to_obj(newbelt, &oaf);

	oaf.location = APPLY_DAMROLL;
	oaf.modifier = std::max((newbelt->value[4] + 1) / 2 - (newbelt->value[4] % 2) + 1, 1);
	affect_to_obj(newbelt, &oaf);

	equip_char(ch, newbelt, WEAR_WAIST, false);

	/* Handling of keeping track of the victims trophied on the belt. */

	if (newbelt->value[4] == 0)
	{

		ch->pcdata->trophy = new_trophy_data(victim->true_name);
	}
	else
	{
		placeholder = ch->pcdata->trophy;

		for (i = 1; i < newbelt->value[4]; i++)
		{
			if (!ch->pcdata->trophy)
				break;

			if (!ch->pcdata->trophy->next)
				break;

			ch->pcdata->trophy = ch->pcdata->trophy->next;
		}

		ch->pcdata->trophy = ch->pcdata->trophy->next = new_trophy_data(victim->true_name);
		ch->pcdata->trophy = placeholder;
	}

	newbelt->value[4]++;
}